

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTessellationTests.cpp
# Opt level: O2

string * __thiscall
deqp::gles31::Functional::(anonymous_namespace)::UserDefinedIOCase::IOBlock::declare_abi_cxx11_
          (string *__return_storage_ptr__,void *this)

{
  ostream *poVar1;
  long lVar2;
  long lVar3;
  DeclareVariable local_1e8;
  ostringstream buf;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&buf);
  poVar1 = std::operator<<((ostream *)&buf,(string *)((long)this + 8));
  poVar1 = std::operator<<(poVar1,"\n");
  std::operator<<(poVar1,"{\n");
  lVar3 = 0;
  for (lVar2 = 0;
      lVar2 < (int)((*(long *)((long)this + 0x50) - *(long *)((long)this + 0x48)) / 0x38);
      lVar2 = lVar2 + 1) {
    poVar1 = std::operator<<((ostream *)&buf,"\t");
    glu::decl::DeclareVariable::DeclareVariable
              (&local_1e8,(VarType *)(*(long *)((long)this + 0x48) + lVar3 + 0x20),
               (string *)(*(long *)((long)this + 0x48) + lVar3),0);
    poVar1 = glu::decl::operator<<(poVar1,&local_1e8);
    std::operator<<(poVar1,";\n");
    glu::decl::DeclareVariable::~DeclareVariable(&local_1e8);
    lVar3 = lVar3 + 0x38;
  }
  poVar1 = std::operator<<((ostream *)&buf,"} ");
  poVar1 = std::operator<<(poVar1,(string *)((long)this + 0x28));
  std::operator<<(poVar1,";\n");
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&buf);
  return __return_storage_ptr__;
}

Assistant:

string UserDefinedIOCase::IOBlock::declare (void) const
{
	std::ostringstream buf;

	buf << m_blockName << "\n"
		<< "{\n";

	for (int i = 0; i < (int)m_members.size(); i++)
		buf << "\t" << glu::declare(m_members[i].type, m_members[i].name) << ";\n";

	buf << "} " << m_interfaceName << ";\n";
	return buf.str();
}